

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O3

void __thiscall
soplex::SPxMainSM<double>::FreeZeroObjVariablePS::execute
          (FreeZeroObjVariablePS *this,VectorBase<double> *x,VectorBase<double> *y,
          VectorBase<double> *s,VectorBase<double> *r,
          DataArray<soplex::SPxSolverBase<double>::VarStatus> *cStatus,
          DataArray<soplex::SPxSolverBase<double>::VarStatus> *rStatus,bool isOptimal)

{
  undefined8 uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  pointer pdVar6;
  Nonzero<double> *pNVar7;
  pointer pdVar8;
  VarStatus *pVVar9;
  Nonzero<double> *pNVar10;
  VarStatus *pVVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  pointer pDVar14;
  long lVar15;
  VarStatus VVar16;
  long lVar17;
  ulong uVar18;
  int *piVar19;
  ulong uVar20;
  uint n;
  ulong uVar21;
  long in_FS_OFFSET;
  bool bVar22;
  bool bVar23;
  undefined4 uVar24;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 uVar25;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  double dVar26;
  double dVar27;
  double dVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  double local_c0;
  double local_a8;
  DSVectorBase<double> local_80;
  DataArray<soplex::SPxSolverBase<double>::VarStatus> *local_60;
  VectorBase<double> *local_58;
  VectorBase<double> *local_50;
  double local_48;
  undefined8 uStack_40;
  VectorBase<double> *local_38;
  
  iVar2 = this->m_j;
  iVar3 = this->m_old_j;
  if (iVar2 != iVar3) {
    pdVar6 = (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar6[iVar3] = pdVar6[iVar2];
    pdVar6 = (r->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar6[iVar3] = pdVar6[iVar2];
    cStatus->data[iVar3] = cStatus->data[iVar2];
  }
  uVar4 = (this->m_col).super_SVectorBase<double>.memused;
  if (0 < (long)(int)uVar4) {
    pNVar7 = (this->m_col).super_SVectorBase<double>.m_elem;
    pdVar6 = (s->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar8 = (y->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pVVar9 = rStatus->data;
    lVar17 = (long)(int)(this->m_old_i - uVar4);
    lVar15 = 0;
    do {
      iVar2 = (&pNVar7->idx)[lVar15];
      *(double *)((long)pdVar6 + lVar15 * 2 + lVar17 * 8 + 8) = pdVar6[iVar2];
      *(double *)((long)pdVar8 + lVar15 * 2 + lVar17 * 8 + 8) = pdVar8[iVar2];
      *(VarStatus *)((long)pVVar9 + lVar15 + lVar17 * 4 + 4) = pVVar9[iVar2];
      lVar15 = lVar15 + 4;
    } while ((long)(int)uVar4 * 4 - lVar15 != 0);
  }
  local_80.super_SVectorBase<double>.m_elem = (Nonzero<double> *)0x0;
  local_80.super_SVectorBase<double>.memsize = 0;
  local_80.super_SVectorBase<double>.memused = 0;
  local_80._vptr_DSVectorBase = (_func_int **)&PTR__DSVectorBase_0069e2b8;
  local_80.theelem = (Nonzero<double> *)0x0;
  n = 2;
  if (0 < (int)uVar4) {
    n = uVar4;
  }
  local_60 = cStatus;
  local_50 = s;
  spx_alloc<soplex::Nonzero<double>*>(&local_80.theelem,n);
  local_80.super_SVectorBase<double>.m_elem = local_80.theelem;
  local_80.super_SVectorBase<double>.memused = 0;
  local_80.super_SVectorBase<double>.memsize = n;
  local_58 = r;
  local_38 = y;
  if (this->m_loFree == false) {
    ::soplex::infinity::__tls_init();
    dVar26 = -*(double *)(in_FS_OFFSET + -8);
    pDVar14 = (this->m_rows).data.
              super__Vector_base<soplex::DSVectorBase<double>,_std::allocator<soplex::DSVectorBase<double>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar21 = 0xffffffff;
    if (0 < (int)((ulong)((long)(this->m_rows).data.
                                super__Vector_base<soplex::DSVectorBase<double>,_std::allocator<soplex::DSVectorBase<double>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pDVar14) >> 5)) {
      uVar20 = 0;
      do {
        lVar15 = (long)pDVar14[uVar20].super_SVectorBase<double>.memused;
        local_a8 = 0.0;
        if (0 < lVar15) {
          pNVar7 = pDVar14[uVar20].super_SVectorBase<double>.m_elem;
          local_a8 = 0.0;
          lVar17 = 0;
          do {
            iVar2 = *(int *)((long)&pNVar7->idx + lVar17);
            if (iVar2 != this->m_j) {
              local_a8 = local_a8 +
                         *(double *)((long)&pNVar7->val + lVar17) *
                         (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[iVar2];
            }
            lVar17 = lVar17 + 0x10;
          } while (lVar15 * 0x10 != lVar17);
        }
        pNVar7 = (this->m_lRhs).super_SVectorBase<double>.m_elem;
        uVar24 = 0;
        uVar25 = 0;
        if ((pNVar7 != (Nonzero<double> *)0x0) &&
           (lVar15 = (long)(this->m_lRhs).super_SVectorBase<double>.memused, 0 < lVar15)) {
          lVar17 = 0;
          do {
            if (uVar20 == *(uint *)((long)&pNVar7->idx + lVar17)) {
              uVar1 = *(undefined8 *)((long)&pNVar7->val + lVar17);
              uVar24 = (undefined4)uVar1;
              uVar25 = (undefined4)((ulong)uVar1 >> 0x20);
              goto LAB_001fbae1;
            }
            lVar17 = lVar17 + 0x10;
          } while (lVar15 * 0x10 != lVar17);
          uVar24 = 0;
          uVar25 = 0;
        }
LAB_001fbae1:
        local_48 = (double)CONCAT44(uVar25,uVar24);
        uStack_40 = 0;
        if ((pNVar7 != (Nonzero<double> *)0x0) &&
           (lVar15 = (long)(this->m_lRhs).super_SVectorBase<double>.memused, 0 < lVar15)) {
          lVar17 = 0;
          do {
            if (uVar20 == *(uint *)((long)&pNVar7->idx + lVar17)) {
              uVar1 = *(undefined8 *)((long)&pNVar7->val + lVar17);
              uVar24 = (undefined4)uVar1;
              uVar25 = (undefined4)((ulong)uVar1 >> 0x20);
              goto LAB_001fbb1a;
            }
            lVar17 = lVar17 + 0x10;
          } while (lVar15 * 0x10 != lVar17);
        }
        uVar24 = 0;
        uVar25 = 0;
LAB_001fbb1a:
        auVar30._4_4_ = uVar25;
        auVar30._0_4_ = uVar24;
        (*(this->super_PostStep)._vptr_PostStep[7])(this);
        pNVar7 = pDVar14[uVar20].super_SVectorBase<double>.m_elem;
        local_c0 = 0.0;
        if ((pNVar7 != (Nonzero<double> *)0x0) &&
           (lVar15 = (long)pDVar14[uVar20].super_SVectorBase<double>.memused, 0 < lVar15)) {
          lVar17 = 0;
          do {
            if (*(int *)((long)&pNVar7->idx + lVar17) == this->m_j) {
              local_c0 = *(double *)((long)&pNVar7->val + lVar17);
              break;
            }
            lVar17 = lVar17 + 0x10;
          } while (lVar15 * 0x10 != lVar17);
        }
        DSVectorBase<double>::makeMem(&local_80,1);
        if ((local_a8 != 0.0) || (NAN(local_a8))) {
          local_80.super_SVectorBase<double>.m_elem[local_80.super_SVectorBase<double>.memused].idx
               = (int)uVar20;
          local_80.super_SVectorBase<double>.m_elem[local_80.super_SVectorBase<double>.memused].val
               = local_a8;
          local_80.super_SVectorBase<double>.memused =
               local_80.super_SVectorBase<double>.memused + 1;
        }
        auVar30._8_8_ = local_a8;
        dVar28 = ABS(local_48);
        if (ABS(local_48) <= ABS(local_a8)) {
          dVar28 = ABS(local_a8);
        }
        dVar27 = 1.0;
        if (1.0 <= dVar28) {
          dVar27 = dVar28;
        }
        auVar13._8_4_ = SUB84(dVar27,0);
        auVar13._0_8_ = dVar27;
        auVar13._12_4_ = (int)((ulong)dVar27 >> 0x20);
        auVar30 = divpd(auVar30,auVar13);
        dVar28 = auVar30._0_8_ - auVar30._8_8_;
        local_c0 = ((double)(~-(ulong)(ABS(dVar28) <=
                                      (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00)) &
                            (ulong)dVar28) * dVar27) / local_c0;
        if (dVar26 < local_c0) {
          uVar21 = uVar20 & 0xffffffff;
          dVar26 = local_c0;
        }
        uVar20 = uVar20 + 1;
        pDVar14 = (this->m_rows).data.
                  super__Vector_base<soplex::DSVectorBase<double>,_std::allocator<soplex::DSVectorBase<double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      } while ((long)uVar20 <
               (long)(int)((ulong)((long)(this->m_rows).data.
                                         super__Vector_base<soplex::DSVectorBase<double>,_std::allocator<soplex::DSVectorBase<double>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)pDVar14)
                          >> 5));
    }
    dVar28 = this->m_bnd;
    bVar23 = dVar28 == dVar26;
    bVar22 = dVar28 < dVar26;
  }
  else {
    ::soplex::infinity::__tls_init();
    dVar26 = *(double *)(in_FS_OFFSET + -8);
    pDVar14 = (this->m_rows).data.
              super__Vector_base<soplex::DSVectorBase<double>,_std::allocator<soplex::DSVectorBase<double>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar21 = 0xffffffff;
    if (0 < (int)((ulong)((long)(this->m_rows).data.
                                super__Vector_base<soplex::DSVectorBase<double>,_std::allocator<soplex::DSVectorBase<double>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pDVar14) >> 5)) {
      uVar20 = 0;
      do {
        lVar15 = (long)pDVar14[uVar20].super_SVectorBase<double>.memused;
        local_a8 = 0.0;
        if (0 < lVar15) {
          pNVar7 = pDVar14[uVar20].super_SVectorBase<double>.m_elem;
          local_a8 = 0.0;
          lVar17 = 0;
          do {
            iVar2 = *(int *)((long)&pNVar7->idx + lVar17);
            if (iVar2 != this->m_j) {
              local_a8 = local_a8 +
                         *(double *)((long)&pNVar7->val + lVar17) *
                         (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[iVar2];
            }
            lVar17 = lVar17 + 0x10;
          } while (lVar15 * 0x10 != lVar17);
        }
        pNVar7 = (this->m_lRhs).super_SVectorBase<double>.m_elem;
        uVar24 = 0;
        uVar25 = 0;
        if ((pNVar7 != (Nonzero<double> *)0x0) &&
           (lVar15 = (long)(this->m_lRhs).super_SVectorBase<double>.memused, 0 < lVar15)) {
          lVar17 = 0;
          do {
            if (uVar20 == *(uint *)((long)&pNVar7->idx + lVar17)) {
              uVar1 = *(undefined8 *)((long)&pNVar7->val + lVar17);
              uVar24 = (undefined4)uVar1;
              uVar25 = (undefined4)((ulong)uVar1 >> 0x20);
              goto LAB_001fb862;
            }
            lVar17 = lVar17 + 0x10;
          } while (lVar15 * 0x10 != lVar17);
          uVar24 = 0;
          uVar25 = 0;
        }
LAB_001fb862:
        local_48 = (double)CONCAT44(uVar25,uVar24);
        uStack_40 = 0;
        if ((pNVar7 != (Nonzero<double> *)0x0) &&
           (lVar15 = (long)(this->m_lRhs).super_SVectorBase<double>.memused, 0 < lVar15)) {
          lVar17 = 0;
          do {
            if (uVar20 == *(uint *)((long)&pNVar7->idx + lVar17)) {
              uVar1 = *(undefined8 *)((long)&pNVar7->val + lVar17);
              uVar24 = (undefined4)uVar1;
              uVar25 = (undefined4)((ulong)uVar1 >> 0x20);
              goto LAB_001fb89b;
            }
            lVar17 = lVar17 + 0x10;
          } while (lVar15 * 0x10 != lVar17);
        }
        uVar24 = 0;
        uVar25 = 0;
LAB_001fb89b:
        auVar29._4_4_ = uVar25;
        auVar29._0_4_ = uVar24;
        (*(this->super_PostStep)._vptr_PostStep[7])(this);
        pNVar7 = pDVar14[uVar20].super_SVectorBase<double>.m_elem;
        local_c0 = 0.0;
        if ((pNVar7 != (Nonzero<double> *)0x0) &&
           (lVar15 = (long)pDVar14[uVar20].super_SVectorBase<double>.memused, 0 < lVar15)) {
          lVar17 = 0;
          do {
            if (*(int *)((long)&pNVar7->idx + lVar17) == this->m_j) {
              local_c0 = *(double *)((long)&pNVar7->val + lVar17);
              break;
            }
            lVar17 = lVar17 + 0x10;
          } while (lVar15 * 0x10 != lVar17);
        }
        DSVectorBase<double>::makeMem(&local_80,1);
        if ((local_a8 != 0.0) || (NAN(local_a8))) {
          local_80.super_SVectorBase<double>.m_elem[local_80.super_SVectorBase<double>.memused].idx
               = (int)uVar20;
          local_80.super_SVectorBase<double>.m_elem[local_80.super_SVectorBase<double>.memused].val
               = local_a8;
          local_80.super_SVectorBase<double>.memused =
               local_80.super_SVectorBase<double>.memused + 1;
        }
        auVar29._8_8_ = local_a8;
        dVar28 = ABS(local_48);
        if (ABS(local_48) <= ABS(local_a8)) {
          dVar28 = ABS(local_a8);
        }
        dVar27 = 1.0;
        if (1.0 <= dVar28) {
          dVar27 = dVar28;
        }
        auVar12._8_4_ = SUB84(dVar27,0);
        auVar12._0_8_ = dVar27;
        auVar12._12_4_ = (int)((ulong)dVar27 >> 0x20);
        auVar30 = divpd(auVar29,auVar12);
        dVar28 = auVar30._0_8_ - auVar30._8_8_;
        local_c0 = ((double)(~-(ulong)(ABS(dVar28) <=
                                      (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da)) &
                            (ulong)dVar28) * dVar27) / local_c0;
        if (local_c0 < dVar26) {
          uVar21 = uVar20 & 0xffffffff;
          dVar26 = local_c0;
        }
        uVar20 = uVar20 + 1;
        pDVar14 = (this->m_rows).data.
                  super__Vector_base<soplex::DSVectorBase<double>,_std::allocator<soplex::DSVectorBase<double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      } while ((long)uVar20 <
               (long)(int)((ulong)((long)(this->m_rows).data.
                                         super__Vector_base<soplex::DSVectorBase<double>,_std::allocator<soplex::DSVectorBase<double>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)pDVar14)
                          >> 5));
    }
    dVar28 = this->m_bnd;
    bVar23 = dVar26 == dVar28;
    bVar22 = dVar26 < dVar28;
  }
  iVar2 = this->m_j;
  pdVar6 = (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (bVar22 || bVar23) {
    pdVar6[iVar2] = dVar26;
  }
  else {
    pdVar6[iVar2] = dVar28;
    uVar21 = 0xffffffff;
  }
  iVar3 = (this->m_col).super_SVectorBase<double>.memused;
  uVar20 = (ulong)iVar3;
  if ((long)uVar20 < 1) {
    (local_58->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[iVar2] = 0.0;
  }
  else {
    pNVar7 = (this->m_col).super_SVectorBase<double>.m_elem;
    pdVar6 = (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar8 = (local_50->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar18 = 0;
    do {
      uVar24 = 0;
      uVar25 = 0;
      if (0 < local_80.super_SVectorBase<double>.memused &&
          local_80.super_SVectorBase<double>.m_elem != (Nonzero<double> *)0x0) {
        lVar15 = 0;
        do {
          if (uVar18 == *(uint *)((long)&(local_80.super_SVectorBase<double>.m_elem)->idx + lVar15))
          {
            uVar1 = *(undefined8 *)
                     ((long)&(local_80.super_SVectorBase<double>.m_elem)->val + lVar15);
            uVar24 = (undefined4)uVar1;
            uVar25 = (undefined4)((ulong)uVar1 >> 0x20);
            break;
          }
          lVar15 = lVar15 + 0x10;
        } while ((ulong)(uint)local_80.super_SVectorBase<double>.memused << 4 != lVar15);
      }
      pdVar8[pNVar7[uVar18].idx] =
           pNVar7[uVar18].val * pdVar6[iVar2] + (double)CONCAT44(uVar25,uVar24);
      uVar18 = uVar18 + 1;
    } while (uVar18 != uVar20);
    (local_58->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[iVar2] = 0.0;
    if (0 < iVar3) {
      pNVar7 = (this->m_col).super_SVectorBase<double>.m_elem;
      pNVar10 = (this->m_rowObj).super_SVectorBase<double>.m_elem;
      uVar4 = (this->m_rowObj).super_SVectorBase<double>.memused;
      pdVar6 = (local_38->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar18 = 0;
      do {
        iVar5 = pNVar7[uVar18].idx;
        uVar24 = 0;
        uVar25 = 0;
        if (0 < (int)uVar4 && pNVar10 != (Nonzero<double> *)0x0) {
          lVar15 = 0;
          do {
            if (*(int *)((long)&pNVar10->idx + lVar15) == iVar5) {
              uVar1 = *(undefined8 *)((long)&pNVar10->val + lVar15);
              uVar24 = (undefined4)uVar1;
              uVar25 = (undefined4)((ulong)uVar1 >> 0x20);
              break;
            }
            lVar15 = lVar15 + 0x10;
          } while ((ulong)uVar4 << 4 != lVar15);
        }
        pdVar6[iVar5] = (double)CONCAT44(uVar25,uVar24);
        uVar18 = uVar18 + 1;
      } while (uVar18 != uVar20);
      if (0 < iVar3) {
        pNVar7 = (this->m_col).super_SVectorBase<double>.m_elem;
        pVVar9 = rStatus->data;
        pVVar11 = local_60->data;
        bVar23 = this->m_loFree;
        lVar15 = 0;
        do {
          if (uVar21 * 0x10 == lVar15) {
            pVVar11[iVar2] = BASIC;
            if ((bVar23 & 1U) == 0) {
              bVar22 = 0.0 < pNVar7[uVar21].val;
            }
            else {
              bVar22 = pNVar7[uVar21].val <= 0.0;
            }
            VVar16 = (VarStatus)bVar22;
            piVar19 = &pNVar7[uVar21].idx;
          }
          else {
            piVar19 = (int *)((long)&pNVar7->idx + lVar15);
            VVar16 = BASIC;
          }
          pVVar9[*piVar19] = VVar16;
          lVar15 = lVar15 + 0x10;
        } while (uVar20 * 0x10 != lVar15);
      }
    }
  }
  if ((int)uVar21 == -1) {
    local_60->data[iVar2] = this->m_loFree ^ ON_LOWER;
  }
  local_80._vptr_DSVectorBase = (_func_int **)&PTR__DSVectorBase_0069e2b8;
  if (local_80.theelem != (Nonzero<double> *)0x0) {
    free(local_80.theelem);
  }
  return;
}

Assistant:

void SPxMainSM<R>::FreeZeroObjVariablePS::execute(VectorBase<R>& x, VectorBase<R>& y,
      VectorBase<R>& s, VectorBase<R>& r,
      DataArray<typename SPxSolverBase<R>::VarStatus>& cStatus,
      DataArray<typename SPxSolverBase<R>::VarStatus>& rStatus, bool isOptimal) const
{
   // correcting the change of idx by deletion of the column and corresponding rows:
   if(m_j != m_old_j)
   {
      x[m_old_j] = x[m_j];
      r[m_old_j] = r[m_j];
      cStatus[m_old_j] = cStatus[m_j];
   }

   int rIdx = m_old_i - m_col.size() + 1;

   for(int k = 0; k < m_col.size(); ++k)
   {
      int rIdx_new = m_col.index(k);
      s[rIdx] = s[rIdx_new];
      y[rIdx] = y[rIdx_new];
      rStatus[rIdx] = rStatus[rIdx_new];
      rIdx++;
   }

   // primal:
   int      domIdx = -1;
   DSVectorBase<R> slack(m_col.size());

   if(m_loFree)
   {
      R minRowUp = R(infinity);

      for(int k = 0; k < m_rows.size(); ++k)
      {
         R           val = 0.0;
         const SVectorBase<R>& row = m_rows[k];

         for(int l = 0; l < row.size(); ++l)
         {
            if(row.index(l) != m_j)
               val += row.value(l) * x[row.index(l)];
         }

         R scale = maxAbs(m_lRhs[k], val);

         if(scale < 1.0)
            scale = 1.0;

         R z = (m_lRhs[k] / scale) - (val / scale);

         if(isZero(z, this->epsilon()))
            z = 0.0;

         R up = z * scale / row[m_j];
         slack.add(k, val);

         if(up < minRowUp)
         {
            minRowUp = up;
            domIdx   = k;
         }
      }

      if(m_bnd < minRowUp)
      {
         x[m_j] = m_bnd;
         domIdx = -1;
      }
      else
         x[m_j] = minRowUp;
   }
   else
   {
      R maxRowLo = R(-infinity);

      for(int k = 0; k < m_rows.size(); ++k)
      {
         R val = 0.0;
         const SVectorBase<R>& row = m_rows[k];

         for(int l = 0; l < row.size(); ++l)
         {
            if(row.index(l) != m_j)
               val += row.value(l) * x[row.index(l)];
         }

         R scale = maxAbs(m_lRhs[k], val);

         if(scale < 1.0)
            scale = 1.0;

         R z = (m_lRhs[k] / scale) - (val / scale);

         if(isZero(z, this->epsilon()))
            z = 0.0;

         R lo = z * scale / row[m_j];
         slack.add(k, val);

         if(lo > maxRowLo)
         {
            maxRowLo = lo;
            domIdx   = k;
         }
      }

      if(m_bnd > maxRowLo)
      {
         x[m_j] = m_bnd;
         domIdx = -1;
      }
      else
         x[m_j] = maxRowLo;
   }

   for(int k = 0; k < m_col.size(); ++k)
      s[m_col.index(k)] = slack[k] + m_col.value(k) * x[m_j];

   // dual:
   r[m_j] = 0.0;

   for(int k = 0; k < m_col.size(); ++k)
   {
      int idx = m_col.index(k);
      y[idx] = m_rowObj[idx];
   }

   // basis:
   for(int k = 0; k < m_col.size(); ++k)
   {
      if(k != domIdx)
         rStatus[m_col.index(k)] = SPxSolverBase<R>::BASIC;

      else
      {
         cStatus[m_j] = SPxSolverBase<R>::BASIC;

         if(m_loFree)
            rStatus[m_col.index(k)] = (m_col.value(k) > 0) ? SPxSolverBase<R>::ON_UPPER :
                                      SPxSolverBase<R>::ON_LOWER;
         else
            rStatus[m_col.index(k)] = (m_col.value(k) > 0) ? SPxSolverBase<R>::ON_LOWER :
                                      SPxSolverBase<R>::ON_UPPER;
      }
   }

   if(domIdx == -1)
   {
      if(m_loFree)
         cStatus[m_j] = SPxSolverBase<R>::ON_UPPER;
      else
         cStatus[m_j] = SPxSolverBase<R>::ON_LOWER;
   }

#ifdef SOPLEX_CHECK_BASIS_DIM

   if(!this->checkBasisDim(rStatus, cStatus))
   {
      throw SPxInternalCodeException("XMAISM20 Dimension doesn't match after this step.");
   }

#endif
}